

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O0

string * __thiscall
deqp::sl::ShaderCase::specializeVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,ShaderCase *this,char *src,ValueBlock *valueBlock)

{
  bool bVar1;
  DataType DVar2;
  char *pcVar3;
  char *pcVar4;
  ostream *poVar5;
  size_type sVar6;
  const_reference pvVar7;
  char *pcVar8;
  char *pcVar9;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_basic_string<char>_>_>::value,_pair<iterator,_bool>_>
  _Var10;
  allocator<char> local_6f9;
  string local_6f8;
  undefined1 local_6d8 [8];
  StringTemplate tmpl;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6a8;
  _Base_ptr local_668;
  undefined1 local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_638;
  _Base_ptr local_5f8;
  undefined1 local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5c8;
  _Base_ptr local_588;
  undefined1 local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_558;
  undefined1 local_518 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  char *refTypeStr;
  char *floatTypeStr;
  DataType floatType;
  char *valueName;
  Value *val;
  int ndx;
  char *vtxOut;
  char *vtxIn;
  undefined1 local_4a0 [7];
  bool usesInout;
  ostringstream output;
  undefined1 local_318 [8];
  ostringstream setup;
  ostringstream decl;
  ValueBlock *valueBlock_local;
  char *src_local;
  ShaderCase *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&setup.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a0);
  bVar1 = usesShaderInoutQualifiers(this->m_targetVersion);
  pcVar3 = "attribute";
  if (bVar1) {
    pcVar3 = "in";
  }
  pcVar4 = "varying";
  if (bVar1) {
    pcVar4 = "out";
  }
  std::operator<<((ostream *)local_4a0,"gl_Position = dEQP_Position;\n");
  poVar5 = std::operator<<((ostream *)&setup.field_0x170,pcVar3);
  std::operator<<(poVar5," highp vec4 dEQP_Position;\n");
  for (val._4_4_ = 0;
      sVar6 = std::vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
              ::size(&valueBlock->values), val._4_4_ < (int)sVar6; val._4_4_ = val._4_4_ + 1) {
    pvVar7 = std::vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
             ::operator[](&valueBlock->values,(long)val._4_4_);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    DVar2 = glu::getDataTypeFloatScalars(pvVar7->dataType);
    pcVar9 = glu::getDataTypeName(DVar2);
    params._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)glu::getDataTypeName(pvVar7->dataType);
    if (pvVar7->storageType == STORAGE_INPUT) {
      DVar2 = glu::getDataTypeScalarType(pvVar7->dataType);
      if (DVar2 == TYPE_FLOAT) {
        poVar5 = std::operator<<((ostream *)&setup.field_0x170,pcVar3);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = std::operator<<(poVar5,pcVar9);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = std::operator<<(poVar5,pcVar8);
        std::operator<<(poVar5,";\n");
      }
      else {
        poVar5 = std::operator<<((ostream *)&setup.field_0x170,pcVar3);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = std::operator<<(poVar5,pcVar9);
        poVar5 = std::operator<<(poVar5," a_");
        poVar5 = std::operator<<(poVar5,pcVar8);
        std::operator<<(poVar5,";\n");
        poVar5 = std::operator<<((ostream *)local_318,
                                 (char *)params._M_t._M_impl.super__Rb_tree_header._M_node_count);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = std::operator<<(poVar5,pcVar8);
        poVar5 = std::operator<<(poVar5," = ");
        poVar5 = std::operator<<(poVar5,(char *)params._M_t._M_impl.super__Rb_tree_header.
                                                _M_node_count);
        poVar5 = std::operator<<(poVar5,"(a_");
        poVar5 = std::operator<<(poVar5,pcVar8);
        std::operator<<(poVar5,");\n");
      }
    }
    else if (pvVar7->storageType == STORAGE_OUTPUT) {
      DVar2 = glu::getDataTypeScalarType(pvVar7->dataType);
      if (DVar2 == TYPE_FLOAT) {
        poVar5 = std::operator<<((ostream *)&setup.field_0x170,pcVar4);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = std::operator<<(poVar5,pcVar9);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = std::operator<<(poVar5,pcVar8);
        std::operator<<(poVar5,";\n");
      }
      else {
        poVar5 = std::operator<<((ostream *)&setup.field_0x170,pcVar4);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = std::operator<<(poVar5,pcVar9);
        poVar5 = std::operator<<(poVar5," v_");
        poVar5 = std::operator<<(poVar5,pcVar8);
        std::operator<<(poVar5,";\n");
        poVar5 = std::operator<<((ostream *)&setup.field_0x170,
                                 (char *)params._M_t._M_impl.super__Rb_tree_header._M_node_count);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = std::operator<<(poVar5,pcVar8);
        std::operator<<(poVar5,";\n");
        poVar5 = std::operator<<((ostream *)local_4a0,"v_");
        poVar5 = std::operator<<(poVar5,pcVar8);
        poVar5 = std::operator<<(poVar5," = ");
        poVar5 = std::operator<<(poVar5,pcVar9);
        poVar5 = std::operator<<(poVar5,"(");
        poVar5 = std::operator<<(poVar5,pcVar8);
        std::operator<<(poVar5,");\n");
      }
    }
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_518);
  std::__cxx11::ostringstream::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_558,(char (*) [13])0x2c58f9c,&local_578);
  _Var10 = std::
           map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                     ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                       *)local_518,&local_558);
  local_588 = (_Base_ptr)_Var10.first._M_node;
  local_580 = _Var10.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_558);
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::ostringstream::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_5c8,(char (*) [6])0x2a61943,&local_5e8);
  _Var10 = std::
           map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                     ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                       *)local_518,&local_5c8);
  local_5f8 = (_Base_ptr)_Var10.first._M_node;
  local_5f0 = _Var10.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_5c8);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::ostringstream::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[7],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_638,(char (*) [7])0x2c60a9b,&local_658);
  _Var10 = std::
           map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                     ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                       *)local_518,&local_638);
  local_668 = (_Base_ptr)_Var10.first._M_node;
  local_660 = _Var10.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_638);
  std::__cxx11::string::~string((string *)&local_658);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[20],_const_char_(&)[12],_true>
            (&local_6a8,(char (*) [20])"POSITION_FRAG_COLOR",(char (*) [12])0x29a1afa);
  _Var10 = std::
           map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                     ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                       *)local_518,&local_6a8);
  tmpl.m_template.field_2._8_8_ = _Var10.first._M_node;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_6a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f8,src,&local_6f9);
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_6d8,&local_6f8);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::allocator<char>::~allocator(&local_6f9);
  tcu::StringTemplate::specialize
            (__return_storage_ptr__,(StringTemplate *)local_6d8,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_518);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_6d8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_518);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&setup.field_0x170);
  return __return_storage_ptr__;
}

Assistant:

string ShaderCase::specializeVertexShader(const char* src, const ValueBlock& valueBlock)
{
	ostringstream decl;
	ostringstream setup;
	ostringstream output;
	const bool	usesInout = usesShaderInoutQualifiers(m_targetVersion);
	const char*   vtxIn		= usesInout ? "in" : "attribute";
	const char*   vtxOut	= usesInout ? "out" : "varying";

	// Output (write out position).
	output << "gl_Position = dEQP_Position;\n";

	// Declarations (position + attribute for each input, varying for each output).
	decl << vtxIn << " highp vec4 dEQP_Position;\n";
	for (int ndx = 0; ndx < (int)valueBlock.values.size(); ndx++)
	{
		const ShaderCase::Value& val		  = valueBlock.values[ndx];
		const char*				 valueName	= val.valueName.c_str();
		DataType				 floatType	= getDataTypeFloatScalars(val.dataType);
		const char*				 floatTypeStr = getDataTypeName(floatType);
		const char*				 refTypeStr   = getDataTypeName(val.dataType);

		if (val.storageType == ShaderCase::Value::STORAGE_INPUT)
		{
			if (getDataTypeScalarType(val.dataType) == TYPE_FLOAT)
			{
				decl << vtxIn << " " << floatTypeStr << " " << valueName << ";\n";
			}
			else
			{
				decl << vtxIn << " " << floatTypeStr << " a_" << valueName << ";\n";
				setup << refTypeStr << " " << valueName << " = " << refTypeStr << "(a_" << valueName << ");\n";
			}
		}
		else if (val.storageType == ShaderCase::Value::STORAGE_OUTPUT)
		{
			if (getDataTypeScalarType(val.dataType) == TYPE_FLOAT)
				decl << vtxOut << " " << floatTypeStr << " " << valueName << ";\n";
			else
			{
				decl << vtxOut << " " << floatTypeStr << " v_" << valueName << ";\n";
				decl << refTypeStr << " " << valueName << ";\n";

				output << "v_" << valueName << " = " << floatTypeStr << "(" << valueName << ");\n";
			}
		}
	}

	// Shader specialization.
	map<string, string> params;
	params.insert(pair<string, string>("DECLARATIONS", decl.str()));
	params.insert(pair<string, string>("SETUP", setup.str()));
	params.insert(pair<string, string>("OUTPUT", output.str()));
	params.insert(pair<string, string>("POSITION_FRAG_COLOR", "gl_Position"));

	StringTemplate tmpl(src);
	return tmpl.specialize(params);
}